

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_set.c
# Opt level: O0

int mpt_meta_set(mpt_metatype **mptr,mpt_value *val)

{
  int iVar1;
  long *local_68;
  mpt_iterator *it;
  mpt_value tmp;
  long *plStack_48;
  int err;
  mpt_config *cfg;
  mpt_object *obj;
  mpt_metatype *pmStack_30;
  int ret;
  mpt_metatype *mt;
  mpt_metatype *old;
  mpt_value *val_local;
  mpt_metatype **mptr_local;
  
  obj._4_4_ = 0;
  mt = *mptr;
  old = (mpt_metatype *)val;
  val_local = (mpt_value *)mptr;
  if (mt != (mpt_metatype *)0x0) {
    obj._4_4_ = (*(mt->_vptr->convertable).convert)((mpt_convertable *)mt,0,(void *)0x0);
    if (obj._4_4_ < 0) {
      obj._4_4_ = 0;
    }
    cfg = (mpt_config *)0x0;
    iVar1 = (*(mt->_vptr->convertable).convert)((mpt_convertable *)mt,0x84,&cfg);
    if ((-1 < iVar1) && (cfg != (mpt_config *)0x0)) {
      if (old != (mpt_metatype *)0x0) {
        it = (mpt_iterator *)old->_vptr;
        tmp._addr = old[1]._vptr;
        iVar1 = mpt_object_set_value((mpt_object *)cfg,(char *)0x0,(mpt_value *)&it);
        if (iVar1 < 0) {
          return iVar1;
        }
        return obj._4_4_;
      }
      tmp._type._4_4_ = (*cfg->_vptr->assign)(cfg,(mpt_path *)0x0,(mpt_value *)0x0);
      if (-1 < tmp._type._4_4_) {
        return obj._4_4_;
      }
    }
    plStack_48 = (long *)0x0;
    iVar1 = (*(mt->_vptr->convertable).convert)((mpt_convertable *)mt,0x85,&stack0xffffffffffffffb8)
    ;
    if (((-1 < iVar1) && (plStack_48 != (long *)0x0)) &&
       (obj._4_4_ = (**(code **)(*plStack_48 + 8))(plStack_48,0,old), -1 < obj._4_4_)) {
      return obj._4_4_;
    }
  }
  if (old == (mpt_metatype *)0x0) {
    local_68 = (long *)0x0;
    if (((mt != (mpt_metatype *)0x0) &&
        (iVar1 = (*(mt->_vptr->convertable).convert)((mpt_convertable *)mt,0x86,&local_68),
        -1 < iVar1)) &&
       ((local_68 != (long *)0x0 && (iVar1 = (**(code **)(*local_68 + 0x10))(local_68), -1 < iVar1))
       )) {
      return obj._4_4_;
    }
    pmStack_30 = mpt_metatype_default();
    obj._4_4_ = 0;
  }
  else {
    pmStack_30 = mpt_meta_new((mpt_value *)old);
    if (pmStack_30 == (mpt_metatype *)0x0) {
      return -4;
    }
    obj._4_4_ = (*(pmStack_30->_vptr->convertable).convert)
                          ((mpt_convertable *)pmStack_30,0,(void *)0x0);
    if (obj._4_4_ < 0) {
      obj._4_4_ = 0;
    }
  }
  if (mt != (mpt_metatype *)0x0) {
    (*mt->_vptr->unref)(mt);
  }
  val_local->_addr = pmStack_30;
  return obj._4_4_;
}

Assistant:

extern int mpt_meta_set(MPT_INTERFACE(metatype) **mptr, const MPT_STRUCT(value) *val)
{
	
	MPT_INTERFACE(metatype) *old, *mt;
	int ret = 0;
	
	if ((old = *mptr)) {
		/* try assign existing data */
		MPT_INTERFACE(object) *obj;
		MPT_INTERFACE(config) *cfg;
		
		if ((ret = MPT_metatype_convert(old, 0, 0)) < 0) {
			ret = 0;
		}
		obj = 0;
		if ((MPT_metatype_convert(old, MPT_ENUM(TypeObjectPtr), &obj)) >= 0
		 && obj) {
			int err;
			if (val) {
				MPT_STRUCT(value) tmp = *val;
				if ((err = mpt_object_set_value(obj, 0, &tmp)) < 0) {
					return err;
				}
				return ret;
			}
			if ((err = obj->_vptr->set_property(obj, 0, 0)) >= 0) {
				return ret;
			}
		}
		cfg = 0;
		if ((MPT_metatype_convert(old, MPT_ENUM(TypeConfigPtr), &cfg)) >= 0
		    && cfg
		    && (ret = cfg->_vptr->assign(cfg, 0, val)) >= 0) {
			return ret;
		}
	}
	/* default config data */
	if (!val) {
		/* try to reset existing iterator */
		MPT_INTERFACE(iterator) *it = 0;
		
		if (old
		    && MPT_metatype_convert(old, MPT_ENUM(TypeIteratorPtr), &it) >= 0
		    && it
		    && it->_vptr->reset(it) >= 0) {
			return ret;
		}
		mt = mpt_metatype_default();
		ret = 0;
	}
	/* create new metatype for data */
	else if (!(mt = mpt_meta_new(val))) {
		return MPT_ERROR(BadOperation);
	}
	else if ((ret = MPT_metatype_convert(mt, 0, 0)) < 0) {
		ret = 0;
	}
	if (old) {
		old->_vptr->unref(old);
	}
	*mptr = mt;
	return ret;
}